

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

char * aobjnam(obj *otmp,char *verb)

{
  char *__src;
  char local_78 [8];
  char prefix [80];
  char *local_20;
  char *bp;
  char *verb_local;
  obj *otmp_local;
  
  local_20 = cxname(otmp);
  if (otmp->quan != 1) {
    sprintf(local_78,"%d ",(ulong)(uint)otmp->quan);
    local_20 = strprepend(local_20,local_78);
  }
  if (verb != (char *)0x0) {
    strcat(local_20," ");
    __src = otense(otmp,verb);
    strcat(local_20,__src);
  }
  return local_20;
}

Assistant:

char *aobjnam(const struct obj *otmp, const char *verb)
{
	char *bp = cxname(otmp);
	char prefix[PREFIX];

	if (otmp->quan != 1L) {
		sprintf(prefix, "%d ", otmp->quan);
		bp = strprepend(bp, prefix);
	}

	if (verb) {
	    strcat(bp, " ");
	    strcat(bp, otense(otmp, verb));
	}
	return bp;
}